

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O2

int send_sasl_header(SASL_CLIENT_IO_INSTANCE *sasl_client_io_instance)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  LOG_CATEGORY LVar4;
  char *pcVar5;
  
  iVar1 = xio_send(sasl_client_io_instance->underlying_io,"AMQP\x03\x01",8,
                   unchecked_on_send_complete,(void *)0x0);
  if (iVar1 == 0) {
    if ((sasl_client_io_instance->field_0x78 & 1) == 0) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0;
    }
    pcVar5 = "-> Header (AMQP 3.1.0.0)";
    iVar3 = 0;
    LVar4 = AZ_LOG_TRACE;
    iVar1 = 0xb0;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0xaa;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xaa;
    }
    pcVar5 = "Sending SASL header failed";
    LVar4 = AZ_LOG_ERROR;
    iVar1 = 0xa9;
  }
  (*p_Var2)(LVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
            ,"send_sasl_header",iVar1,1,pcVar5);
  return iVar3;
}

Assistant:

static int send_sasl_header(SASL_CLIENT_IO_INSTANCE* sasl_client_io_instance)
{
    int result;

    /* Codes_SRS_SASLCLIENTIO_01_078: [SASL client IO shall start the header exchange by sending the SASL header.] */
    /* Codes_SRS_SASLCLIENTIO_01_095: [Sending the header shall be done by using `xio_send`.]*/
    if (xio_send(sasl_client_io_instance->underlying_io, sasl_header, sizeof(sasl_header), unchecked_on_send_complete, NULL) != 0)
    {
        LogError("Sending SASL header failed");
        result = MU_FAILURE;
    }
    else
    {
        if (sasl_client_io_instance->is_trace_on != 0)
        {
            LOG(AZ_LOG_TRACE, LOG_LINE, "-> Header (AMQP 3.1.0.0)");
        }

        result = 0;
    }

    return result;
}